

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O2

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genStructField
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Field field,Schema scope,
          Indent indent)

{
  Branch *pBVar1;
  Reader list;
  Reader type;
  Reader value;
  Reader value_00;
  Reader list_00;
  bool bVar2;
  ulong uVar3;
  Field FVar4;
  undefined8 uVar5;
  bool bVar6;
  StructSchema schema;
  size_t sVar7;
  char *pcVar8;
  anon_union_8_2_eba6ea51_for_Type_5 aVar9;
  size_t sVar10;
  size_t sVar11;
  char *pcVar12;
  undefined4 in_register_0000000c;
  unsigned_short *puVar13;
  size_type extraout_RDX_00;
  char (*params) [1];
  size_t sVar14;
  size_type extraout_RDX_02;
  int iVar15;
  CapnpcCapnpMain *this_00;
  StringTree *this_01;
  char (*in_R8) [2];
  StringTree *pSVar16;
  Reader RVar17;
  Type TVar18;
  initializer_list<unsigned_long> nums;
  initializer_list<unsigned_long> nums_00;
  initializer_list<unsigned_long> nums_01;
  initializer_list<unsigned_long> nums_02;
  initializer_list<unsigned_long> nums_03;
  initializer_list<unsigned_long> nums_04;
  Type type_00;
  unsigned_short local_46a;
  StringTree *local_468;
  char *local_460;
  size_t local_458;
  size_t local_450;
  Indent local_448;
  ushort local_442;
  Array<kj::StringTree::Branch> local_440;
  ArrayPtr<const_char> local_428;
  ArrayPtr<const_char> local_418;
  ArrayPtr<const_char> local_408;
  CappedArray<char,_8UL> local_3f8;
  Reader proto;
  ArrayPtr<const_char> local_3b0;
  int local_39c;
  int local_398;
  char local_394 [4];
  StringTree local_390;
  Reader slot;
  StringTree local_320;
  ArrayPtr<const_char> local_2e8;
  StringTree local_2d8;
  StringTree local_2a0;
  StringTree local_268;
  StringTree local_230;
  Reader local_1f8;
  Reader local_1c8;
  CapnpcCapnpMain local_198;
  Type local_168;
  size_t local_158;
  size_t sStack_150;
  size_t local_148;
  size_t local_140;
  size_t sStack_138;
  Branch *local_130;
  ulong local_128;
  size_t sStack_120;
  char *pcStack_118;
  size_t local_110;
  Reader local_108;
  Reader local_d8;
  Reader local_a8;
  undefined1 local_78 [72];
  size_type extraout_RDX;
  size_type extraout_RDX_01;
  
  FVar4 = field;
  puVar13 = (unsigned_short *)CONCAT44(in_register_0000000c,indent.amount);
  proto._reader.dataSize = field.proto._reader.dataSize;
  proto._reader.pointerCount = field.proto._reader.pointerCount;
  proto._reader._38_2_ = field.proto._reader._38_2_;
  uVar5 = proto._reader._32_8_;
  proto._reader.nestingLimit = field.proto._reader.nestingLimit;
  proto._reader._44_4_ = field.proto._reader._44_4_;
  proto._reader.data = field.proto._reader.data;
  proto._reader.pointers = field.proto._reader.pointers;
  proto._reader.segment = field.proto._reader.segment;
  proto._reader.capTable = field.proto._reader.capTable;
  proto._reader.dataSize = FVar4.proto._reader.dataSize;
  local_468 = __return_storage_ptr__;
  proto._reader._32_8_ = uVar5;
  if (0x4f < proto._reader.dataSize) {
    if (*(short *)((long)field.proto._reader.data + 8) == 1) {
      local_168 = StructSchema::Field::getType(&field);
      schema = Type::asStruct(&local_168);
      RVar17 = capnp::schema::Field::Reader::getName(&proto);
      capnp::schema::Field::Reader::getAnnotations(&local_d8,&proto);
      list.reader.capTable = local_d8.reader.capTable;
      list.reader.segment = local_d8.reader.segment;
      list.reader.ptr = local_d8.reader.ptr;
      list.reader.elementCount = local_d8.reader.elementCount;
      list.reader.step = local_d8.reader.step;
      list.reader.structDataSize = local_d8.reader.structDataSize;
      list.reader.structPointerCount = local_d8.reader.structPointerCount;
      list.reader.elementSize = local_d8.reader.elementSize;
      list.reader._39_1_ = local_d8.reader._39_1_;
      list.reader.nestingLimit = local_d8.reader.nestingLimit;
      list.reader._44_4_ = local_d8.reader._44_4_;
      genAnnotations(&local_320,this,list,scope);
      if ((proto._reader.dataSize < 0x20) || (*(ushort *)((long)proto._reader.data + 2) == 0)) {
        kj::StringTree::concat<>();
      }
      else {
        local_3b0.ptr._0_2_ = ~*(ushort *)((long)proto._reader.data + 2);
        kj::strTree<char_const(&)[17],unsigned_short>
                  (&local_2a0,(kj *)"  # union tag = ",(char (*) [17])&local_3b0,puVar13);
      }
      genStructFields((Array<kj::StringTree> *)&local_2d8,this,schema,(Indent)(indent.amount + 2));
      local_3f8.currentSize._0_4_ = indent.amount;
      aVar9.schema = (RawBrandedSchema *)(RVar17.super_StringPtr.content.size_ - 1);
      local_230.size_ = (size_t)RVar17.super_StringPtr.content.ptr;
      local_230.text.content.ptr = (char *)aVar9.schema;
      slot._reader._0_16_ = kj::toCharSequence<char_const(&)[8]>((char (*) [8])" :group");
      pSVar16 = local_468;
      sVar11 = slot._reader.capTable;
      local_440._0_16_ = kj::toCharSequence<char_const(&)[3]>((char (*) [3])" {");
      sVar10 = local_440.size_;
      local_418 = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x1ae02e);
      sVar7 = local_418.size_;
      kj::operator*(&local_268,&local_2d8);
      local_408.ptr._0_4_ = indent.amount;
      local_460 = (char *)sVar10;
      local_458 = sVar11;
      local_450 = sVar7;
      local_428 = kj::toCharSequence<char_const(&)[3]>((char (*) [3])"}\n");
      sVar10 = local_450;
      sVar11 = local_458;
      pcVar12 = local_460;
      nums._M_len = local_428.size_;
      (pSVar16->branches).size_ = 0;
      (pSVar16->branches).disposer = (ArrayDisposer *)0x0;
      (pSVar16->text).content.disposer = (ArrayDisposer *)0x0;
      (pSVar16->branches).ptr = (Branch *)0x0;
      (pSVar16->text).content.ptr = (char *)0x0;
      (pSVar16->text).content.size_ = 0;
      uVar3 = (ulong)indent.amount;
      local_158 = local_458;
      sStack_150 = local_320.size_;
      local_148 = (size_t)local_460;
      local_140 = local_2a0.size_;
      sStack_138 = local_450;
      local_130 = (Branch *)local_268.size_;
      nums._M_array = (iterator)0xa;
      local_128 = uVar3;
      sStack_120 = nums._M_len;
      local_168._0_8_ = uVar3;
      local_168.field_4.schema = aVar9.schema;
      sVar7 = kj::_::sum((_ *)&local_168,nums);
      pSVar16 = local_468;
      local_158 = sVar11;
      sStack_150 = 0;
      local_148 = (size_t)pcVar12;
      local_140 = 0;
      sStack_138 = sVar10;
      local_130 = (Branch *)0x0;
      local_468->size_ = sVar7;
      nums_00._M_len = extraout_RDX;
      nums_00._M_array = (iterator)0xa;
      local_128 = uVar3;
      sStack_120 = nums._M_len;
      local_168._0_8_ = uVar3;
      local_168.field_4.schema = aVar9.schema;
      sVar11 = kj::_::sum((_ *)&local_168,nums_00);
      kj::heapString((String *)&local_390,sVar11);
      kj::Array<char>::operator=(&(pSVar16->text).content,(Array<char> *)&local_390);
      kj::Array<char>::~Array((Array<char> *)&local_390);
      local_168 = (Type)ZEXT816(0);
      local_158 = 0;
      sStack_150 = 1;
      local_148 = 0;
      local_140 = 1;
      sStack_138 = 0;
      local_130 = (Branch *)0x1;
      local_128 = 0;
      sStack_120 = 0;
      nums_01._M_len = extraout_RDX_00;
      nums_01._M_array = (iterator)0xa;
      pcVar12 = (char *)kj::_::sum((_ *)&local_168,nums_01);
      local_390.size_ =
           (size_t)kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>((size_t)pcVar12);
      local_390.text.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
      local_390.text.content.ptr = pcVar12;
      kj::Array<kj::StringTree::Branch>::operator=
                (&pSVar16->branches,(Array<kj::StringTree::Branch> *)&local_390);
      kj::Array<kj::StringTree::Branch>::~Array((Array<kj::StringTree::Branch> *)&local_390);
      pcVar12 = (char *)(pSVar16->text).content.size_;
      if (pcVar12 != (char *)0x0) {
        pcVar12 = (pSVar16->text).content.ptr;
      }
      pcVar12 = kj::_::fill<capnp::(anonymous_namespace)::Indent>(pcVar12,(Indent *)&local_3f8);
      pcVar12 = kj::_::fill<kj::ArrayPtr<char_const>>(pcVar12,(ArrayPtr<const_char> *)&local_230);
      pcVar8 = kj::_::fill<kj::ArrayPtr<char_const>>(pcVar12,(ArrayPtr<const_char> *)&slot);
      pcVar12 = (char *)(pSVar16->text).content.size_;
      pBVar1 = (pSVar16->branches).ptr;
      if (pcVar12 != (char *)0x0) {
        pcVar12 = (pSVar16->text).content.ptr;
      }
      pBVar1->index = (long)pcVar8 - (long)pcVar12;
      kj::StringTree::operator=(&pBVar1->content,&local_320);
      pcVar8 = kj::_::fill<kj::ArrayPtr<char_const>>(pcVar8,(ArrayPtr<const_char> *)&local_440);
      pcVar12 = (char *)(pSVar16->text).content.size_;
      pBVar1 = (pSVar16->branches).ptr;
      if (pcVar12 != (char *)0x0) {
        pcVar12 = (pSVar16->text).content.ptr;
      }
      pBVar1[1].index = (long)pcVar8 - (long)pcVar12;
      kj::StringTree::operator=(&pBVar1[1].content,&local_2a0);
      kj::StringTree::
      fill<kj::ArrayPtr<char_const>,kj::StringTree,capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
                (pSVar16,pcVar8,2,&local_418,&local_268,(Indent *)&local_408,&local_428);
      kj::StringTree::~StringTree(&local_268);
      kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&local_2d8);
      kj::StringTree::~StringTree(&local_2a0);
      this_01 = &local_320;
      goto LAB_001515c8;
    }
    if (*(short *)((long)field.proto._reader.data + 8) != 0) {
      kj::StringTree::concat<>();
      return __return_storage_ptr__;
    }
  }
  slot._reader.dataSize = field.proto._reader.dataSize;
  slot._reader.pointerCount = field.proto._reader.pointerCount;
  slot._reader._38_2_ = field.proto._reader._38_2_;
  slot._reader.nestingLimit = field.proto._reader.nestingLimit;
  slot._reader._44_4_ = field.proto._reader._44_4_;
  slot._reader.data = field.proto._reader.data;
  slot._reader.pointers = field.proto._reader.pointers;
  slot._reader._0_16_ = FVar4.proto._reader._0_16_;
  capnp::schema::Field::Slot::Reader::getType(&local_108,&slot);
  bVar2 = false;
  iVar15 = 0;
  if (0xf < local_108._reader.dataSize) {
    iVar15 = 8;
    switch(*local_108._reader.data) {
    case 1:
      iVar15 = 1;
    case 2:
    case 6:
      bVar2 = false;
      break;
    case 3:
    case 7:
    case 0xf:
      bVar2 = false;
      iVar15 = 0x10;
      break;
    case 4:
    case 8:
    case 10:
      bVar2 = false;
      iVar15 = 0x20;
      break;
    case 5:
    case 9:
    case 0xb:
      bVar2 = false;
      iVar15 = 0x40;
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0x10:
    case 0x11:
    case 0x12:
      bVar2 = true;
      iVar15 = -1;
      break;
    default:
      bVar2 = false;
      iVar15 = 0;
    }
  }
  RVar17 = capnp::schema::Field::Reader::getName(&proto);
  local_460 = RVar17.super_StringPtr.content.ptr;
  if (proto._reader.dataSize < 0x70) {
    local_46a = 0;
  }
  else {
    local_46a = *(unsigned_short *)((long)proto._reader.data + 0xc);
  }
  capnp::schema::Field::Slot::Reader::getType(&local_a8,&slot);
  aVar9.schema = (RawBrandedSchema *)local_78;
  local_78[0] = 0;
  type._reader.capTable = local_a8._reader.capTable;
  type._reader.segment = local_a8._reader.segment;
  type._reader.data = local_a8._reader.data;
  type._reader.pointers = local_a8._reader.pointers;
  type._reader.dataSize = local_a8._reader.dataSize;
  type._reader.pointerCount = local_a8._reader.pointerCount;
  type._reader._38_2_ = local_a8._reader._38_2_;
  type._reader.nestingLimit = local_a8._reader.nestingLimit;
  type._reader._44_4_ = local_a8._reader._44_4_;
  genType(&local_268,this,type,scope,(Maybe<capnp::InterfaceSchema::Method> *)aVar9.schema);
  this_00 = &local_198;
  capnp::schema::Field::Slot::Reader::getDefaultValue((Reader *)this_00,&slot);
  value._reader.capTable = (CapTableReader *)local_198.schemaLoader.impl.mutex._0_8_;
  value._reader.segment = (SegmentReader *)local_198.context;
  value._reader.data = local_198.schemaLoader.impl.mutex.waitersHead.ptr;
  value._reader.pointers = (WirePointer *)local_198.schemaLoader.impl.mutex.waitersTail;
  value._reader._32_8_ = local_198.schemaLoader.impl.value.disposer;
  value._reader._40_8_ = local_198.schemaLoader.impl.value.ptr;
  bVar6 = isEmptyValue(this_00,value);
  local_458 = CONCAT71(local_458._1_7_,bVar6);
  if (bVar6) {
    kj::strTree<char_const(&)[1]>(&local_320,(kj *)0x1ae02f,params);
  }
  else {
    TVar18 = StructSchema::Field::getType(&field);
    type_00._0_8_ = TVar18.field_4;
    capnp::schema::Field::Slot::Reader::getDefaultValue(&local_1c8,&slot);
    value_00._reader.capTable = local_1c8._reader.capTable;
    value_00._reader.segment = local_1c8._reader.segment;
    value_00._reader.data = local_1c8._reader.data;
    value_00._reader.pointers = local_1c8._reader.pointers;
    value_00._reader.dataSize = local_1c8._reader.dataSize;
    value_00._reader.pointerCount = local_1c8._reader.pointerCount;
    value_00._reader._38_2_ = local_1c8._reader._38_2_;
    value_00._reader.nestingLimit = local_1c8._reader.nestingLimit;
    value_00._reader._44_4_ = local_1c8._reader._44_4_;
    type_00.field_4.schema = aVar9.schema;
    genValue(&local_2a0,TVar18._0_8_,type_00,value_00);
    kj::strTree<char_const(&)[4],kj::StringTree>
              (&local_320,(kj *)0x19d932,(char (*) [4])&local_2a0,(StringTree *)aVar9.schema);
  }
  capnp::schema::Field::Reader::getAnnotations(&local_1f8,&proto);
  list_00.reader.capTable = local_1f8.reader.capTable;
  list_00.reader.segment = local_1f8.reader.segment;
  list_00.reader.ptr = local_1f8.reader.ptr;
  list_00.reader.elementCount = local_1f8.reader.elementCount;
  list_00.reader.step = local_1f8.reader.step;
  list_00.reader.structDataSize = local_1f8.reader.structDataSize;
  list_00.reader.structPointerCount = local_1f8.reader.structPointerCount;
  list_00.reader.elementSize = local_1f8.reader.elementSize;
  list_00.reader._39_1_ = local_1f8.reader._39_1_;
  list_00.reader.nestingLimit = local_1f8.reader.nestingLimit;
  list_00.reader._44_4_ = local_1f8.reader._44_4_;
  genAnnotations(&local_390,this,list_00,scope);
  if (bVar2) {
    local_394[0] = '\0';
    local_394[1] = '\0';
    local_394[2] = '\0';
    local_394[3] = '\0';
    if (0x3f < slot._reader.dataSize) {
      local_394 = *(char (*) [4])((long)slot._reader.data + 4);
    }
    puVar13 = (unsigned_short *)0x1a8d99;
    kj::strTree<char_const(&)[5],unsigned_int,char_const(&)[2]>
              (&local_2d8,(kj *)"ptr[",(char (*) [5])local_394,(uint *)0x1a8d99,in_R8);
  }
  else {
    if (slot._reader.dataSize < 0x40) {
      local_39c = 1;
      local_398 = 0;
    }
    else {
      local_398 = *(int *)((long)slot._reader.data + 4) * iVar15;
      local_39c = *(int *)((long)slot._reader.data + 4) + 1;
    }
    local_39c = local_39c * iVar15;
    puVar13 = (unsigned_short *)0x19d863;
    kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
              (&local_2d8,(kj *)"bits[",(char (*) [6])&local_398,(uint *)0x19d863,
               (char (*) [3])&local_39c,(uint *)0x1a9b4b,(char (*) [2])local_1f8.reader.segment);
  }
  if ((proto._reader.dataSize < 0x20) || (*(ushort *)((long)proto._reader.data + 2) == 0)) {
    kj::StringTree::concat<>();
  }
  else {
    local_442 = ~*(ushort *)((long)proto._reader.data + 2);
    kj::strTree<char_const(&)[15],unsigned_short>
              (&local_230,(kj *)", union tag = ",(char (*) [15])&local_442,puVar13);
  }
  aVar9.schema = (RawBrandedSchema *)(RVar17.super_StringPtr.content.size_ - 1);
  local_418.size_ = (size_t)aVar9.schema;
  local_418.ptr = local_460;
  local_448.amount = indent.amount;
  local_428 = kj::toCharSequence<char_const(&)[3]>((char (*) [3])" @");
  sVar7 = local_428.size_;
  local_3f8 = kj::toCharSequence<unsigned_short>(&local_46a);
  sVar11 = local_3f8.currentSize;
  local_408 = kj::toCharSequence<char_const(&)[3]>((char (*) [3])0x19d8b2);
  sVar14 = local_408.size_;
  local_3b0 = kj::toCharSequence<char_const(&)[6]>((char (*) [6])";  # ");
  sVar10 = local_3b0.size_;
  local_2e8 = kj::toCharSequence<char_const(&)[2]>((char (*) [2])0x1ae02e);
  pSVar16 = local_468;
  nums_02._M_len = local_2e8.size_;
  (local_468->branches).size_ = 0;
  (local_468->branches).disposer = (ArrayDisposer *)0x0;
  (local_468->text).content.disposer = (ArrayDisposer *)0x0;
  (local_468->branches).ptr = (Branch *)0x0;
  (local_468->text).content.ptr = (char *)0x0;
  (local_468->text).content.size_ = 0;
  local_140 = local_268.size_;
  sStack_138 = local_320.size_;
  local_130 = (Branch *)local_390.size_;
  sStack_120 = local_2d8.size_;
  pcStack_118 = (char *)local_230.size_;
  nums_02._M_array = (iterator)0xc;
  local_460 = (char *)sVar10;
  local_450 = nums_02._M_len;
  local_158 = sVar7;
  sStack_150 = sVar11;
  local_148 = sVar14;
  local_128 = sVar10;
  local_110 = nums_02._M_len;
  local_168._0_8_ = (ulong)indent.amount;
  local_168.field_4.schema = aVar9.schema;
  sVar10 = kj::_::sum((_ *)&local_168,nums_02);
  pSVar16->size_ = sVar10;
  local_130 = (Branch *)0x0;
  local_140 = 0;
  sStack_138 = 0;
  local_128 = (ulong)local_460;
  sStack_120 = 0;
  pcStack_118 = (char *)0x0;
  local_110 = local_450;
  nums_03._M_len = extraout_RDX_01;
  nums_03._M_array = (iterator)0xc;
  local_158 = sVar7;
  sStack_150 = sVar11;
  local_148 = sVar14;
  local_168._0_8_ = (ulong)indent.amount;
  local_168.field_4.schema = aVar9.schema;
  sVar11 = kj::_::sum((_ *)&local_168,nums_03);
  kj::heapString((String *)&local_440,sVar11);
  kj::Array<char>::operator=(&(pSVar16->text).content,(Array<char> *)&local_440);
  kj::Array<char>::~Array((Array<char> *)&local_440);
  local_158 = 0;
  sStack_150 = 0;
  local_168 = (Type)ZEXT816(0);
  local_148 = 0;
  local_140 = 1;
  sStack_138 = 1;
  local_130 = (Branch *)0x1;
  local_128 = 0;
  sStack_120 = 1;
  pcStack_118 = (char *)0x1;
  local_110 = 0;
  nums_04._M_len = extraout_RDX_02;
  nums_04._M_array = (iterator)0xc;
  sVar11 = kj::_::sum((_ *)&local_168,nums_04);
  local_440.ptr = kj::_::HeapArrayDisposer::allocate<kj::StringTree::Branch>(sVar11);
  local_440.size_ = sVar11;
  local_440.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  kj::Array<kj::StringTree::Branch>::operator=(&pSVar16->branches,&local_440);
  kj::Array<kj::StringTree::Branch>::~Array(&local_440);
  pcVar12 = (char *)(pSVar16->text).content.size_;
  if (pcVar12 != (char *)0x0) {
    pcVar12 = (pSVar16->text).content.ptr;
  }
  pcVar12 = kj::_::fill<capnp::(anonymous_namespace)::Indent>(pcVar12,&local_448);
  kj::StringTree::
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (pSVar16,pcVar12,0,&local_418,&local_428,&local_3f8,&local_408,&local_268,&local_320,
             &local_390,&local_3b0,&local_2d8,&local_230,&local_2e8);
  kj::StringTree::~StringTree(&local_230);
  kj::StringTree::~StringTree(&local_2d8);
  kj::StringTree::~StringTree(&local_390);
  kj::StringTree::~StringTree(&local_320);
  if ((char)local_458 == '\0') {
    kj::StringTree::~StringTree(&local_2a0);
  }
  this_01 = &local_268;
LAB_001515c8:
  kj::StringTree::~StringTree(this_01);
  return pSVar16;
}

Assistant:

kj::StringTree genStructField(StructSchema::Field field, Schema scope, Indent indent) {
    auto proto = field.getProto();
    switch (proto.which()) {
      case schema::Field::SLOT: {
        auto slot = proto.getSlot();
        int size = typeSizeBits(slot.getType());
        return kj::strTree(
            indent, proto.getName(), " @", proto.getOrdinal().getExplicit(),
            " :", genType(slot.getType(), scope, nullptr),
            isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
            genAnnotations(proto.getAnnotations(), scope),
            ";  # ", size == -1 ? kj::strTree("ptr[", slot.getOffset(), "]")
                                : kj::strTree("bits[", slot.getOffset() * size, ", ",
                                              (slot.getOffset() + 1) * size, ")"),
            hasDiscriminantValue(proto)
                ? kj::strTree(", union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n");
      }
      case schema::Field::GROUP: {
        auto group = field.getType().asStruct();
        return kj::strTree(
            indent, proto.getName(),
            " :group", genAnnotations(proto.getAnnotations(), scope), " {",
            hasDiscriminantValue(proto)
                ? kj::strTree("  # union tag = ", proto.getDiscriminantValue()) : kj::strTree(),
            "\n",
            genStructFields(group, indent.next()),
            indent, "}\n");
      }
    }
    return kj::strTree();
  }